

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prs_check_spec(prscxdef *ctx,prsndef *expr)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  if (expr->prsnnlf == 0) {
    iVar3 = (expr->prsnv).prsnvt.toktyp;
    if (iVar3 == 0x38) {
      bVar2 = (expr->prsnv).prsnvt.toksym.tokstyp;
      if (bVar2 == 3) {
        (expr->prsnv).prsnvt.toksym.tokstyp = '\x0e';
        return;
      }
      if ((1 < bVar2 - 9) && (bVar2 != 6)) {
        return;
      }
    }
    else if (iVar3 != 0x35) {
      return;
    }
    goto LAB_0011f959;
  }
  uVar1 = expr->prsntyp - 0x32;
  if (uVar1 < 0x2e) {
    if ((ulong)uVar1 == 0xe) {
      if (expr->prsnnlf == 3) goto LAB_0011f959;
      expr->prsntyp = 0x1f;
      goto LAB_0011f929;
    }
    if ((0x300000000003U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0011f959;
  }
  if (expr->prsntyp - 0x96U < 0xf) {
LAB_0011f959:
    errsigf(ctx->prscxerr,"TADS",0x167);
  }
LAB_0011f929:
  if (0 < expr->prsnnlf) {
    lVar4 = 0;
    do {
      prs_check_spec(ctx,*(prsndef **)((long)&expr->prsnv + lVar4 * 8));
      lVar4 = lVar4 + 1;
    } while (lVar4 < expr->prsnnlf);
  }
  return;
}

Assistant:

static void prs_check_spec(prscxdef *ctx, prsndef *expr)
{
    int i;
    
    /* 
     *   check the type of this node - if it's an assignment or a function
     *   call, prohibit it 
     */
    if (expr->prsnnlf == 0)
    {
        /* value node - check for a symbol */
        if (expr->prsnv.prsnvt.toktyp == TOKTSYMBOL)
        {
            switch(expr->prsnv.prsnvt.toksym.tokstyp)
            {
            case TOKSTPROP:
                /* 
                 *   convert this to a speculative evaluation property, so
                 *   that the emitter knows to emit the correct opcode for
                 *   it 
                 */
                expr->prsnv.prsnvt.toksym.tokstyp = TOKSTPROPSPEC;
                break;

            case TOKSTBIFN:
            case TOKSTINHERIT:
            case TOKSTEXTERN:
                /* don't allow calls */
                errsig(ctx->prscxerr, ERR_BADSPECEXPR);

            default:
                /* others are okay */
                break;
            }
        }
        else if (expr->prsnv.prsnvt.toktyp == TOKTDSTRING)
        {
            /* don't allow double-quoted strings in speculative evaluation */
            errsig(ctx->prscxerr, ERR_BADSPECEXPR);
        }
    }
    else
    {
        switch(expr->prsntyp)
        {
        case TOKTINC:
        case TOKTDEC:
        case TOKTPOSTINC:
        case TOKTPOSTDEC:
        case TOKTNEW:
        case TOKTDELETE:
        case TOKTLPAR:
        case TOKTASSIGN:
        case TOKTPLEQ:
        case TOKTMINEQ:
        case TOKTDIVEQ:
        case TOKTMODEQ:
        case TOKTTIMEQ:
        case TOKTBANDEQ:
        case TOKTBOREQ:
        case TOKTXOREQ:
        case TOKTSHLEQ:
        case TOKTSHREQ:
        case TOKTRPAR:
            /* assignments and function calls are all prohibited */
            errsig(ctx->prscxerr, ERR_BADSPECEXPR);
            
        case TOKTDOT:
            /* property lookup - only allow no argument version */
            if (expr->prsnnlf == 3)
                errsig(ctx->prscxerr, ERR_BADSPECEXPR);
            
            /* replace with data-only (no method call) version */
            expr->prsntyp = TOKTDOTSPEC;
            break;
            
        default:
            /* other expressions are acceptable */
            break;
        }
        
        /* go through all subnodes of this node */
        for (i = 0 ; i < expr->prsnnlf ; ++i)
            prs_check_spec(ctx, expr->prsnv.prsnvn[i]);
    }
}